

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# networkDataTypes.h
# Opt level: O1

binarydata * __thiscall
NetworkDataType::
serializedata<std::__cxx11::string_const,int_const,int_const,int_const,int_const,int_const>
          (binarydata *__return_storage_ptr__,NetworkDataType *this,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args,int *args_1,
          int *args_2,int *args_3,int *args_4,int *args_5)

{
  PortableBinaryOutputArchive *pPVar1;
  PortableBinaryOutputArchive archive;
  ostringstream stream;
  string local_2d8;
  PortableBinaryOutputArchive local_2b8;
  ostringstream local_1a8 [112];
  ios_base local_138 [264];
  
  std::__cxx11::ostringstream::ostringstream(local_1a8);
  local_2d8._M_dataplus._M_p._0_1_ =
       cereal::portable_binary_detail::is_little_endian()::test == '\x01';
  cereal::PortableBinaryOutputArchive::PortableBinaryOutputArchive
            (&local_2b8,(ostream *)local_1a8,(Options *)&local_2d8);
  pPVar1 = ((((((local_2b8.super_OutputArchive<cereal::PortableBinaryOutputArchive,_1U>.self)->
               super_OutputArchive<cereal::PortableBinaryOutputArchive,_1U>).self)->
             super_OutputArchive<cereal::PortableBinaryOutputArchive,_1U>).self)->
           super_OutputArchive<cereal::PortableBinaryOutputArchive,_1U>).self;
  local_2d8._M_dataplus._M_p = (pointer)this[1]._vptr_NetworkDataType;
  cereal::PortableBinaryOutputArchive::saveBinary<8ul>
            ((((((((((((pPVar1->super_OutputArchive<cereal::PortableBinaryOutputArchive,_1U>).self)
                     ->super_OutputArchive<cereal::PortableBinaryOutputArchive,_1U>).self)->
                   super_OutputArchive<cereal::PortableBinaryOutputArchive,_1U>).self)->
                 super_OutputArchive<cereal::PortableBinaryOutputArchive,_1U>).self)->
               super_OutputArchive<cereal::PortableBinaryOutputArchive,_1U>).self)->
             super_OutputArchive<cereal::PortableBinaryOutputArchive,_1U>).self,&local_2d8,8);
  cereal::PortableBinaryOutputArchive::saveBinary<1ul>
            ((((((pPVar1->super_OutputArchive<cereal::PortableBinaryOutputArchive,_1U>).self)->
               super_OutputArchive<cereal::PortableBinaryOutputArchive,_1U>).self)->
             super_OutputArchive<cereal::PortableBinaryOutputArchive,_1U>).self,
             this->_vptr_NetworkDataType,(size_t)this[1]._vptr_NetworkDataType);
  pPVar1 = ((local_2b8.super_OutputArchive<cereal::PortableBinaryOutputArchive,_1U>.self)->
           super_OutputArchive<cereal::PortableBinaryOutputArchive,_1U>).self;
  cereal::PortableBinaryOutputArchive::saveBinary<4ul>
            ((((((pPVar1->super_OutputArchive<cereal::PortableBinaryOutputArchive,_1U>).self)->
               super_OutputArchive<cereal::PortableBinaryOutputArchive,_1U>).self)->
             super_OutputArchive<cereal::PortableBinaryOutputArchive,_1U>).self,args,4);
  pPVar1 = (pPVar1->super_OutputArchive<cereal::PortableBinaryOutputArchive,_1U>).self;
  cereal::PortableBinaryOutputArchive::saveBinary<4ul>
            ((((((pPVar1->super_OutputArchive<cereal::PortableBinaryOutputArchive,_1U>).self)->
               super_OutputArchive<cereal::PortableBinaryOutputArchive,_1U>).self)->
             super_OutputArchive<cereal::PortableBinaryOutputArchive,_1U>).self,args_1,4);
  pPVar1 = (pPVar1->super_OutputArchive<cereal::PortableBinaryOutputArchive,_1U>).self;
  cereal::PortableBinaryOutputArchive::saveBinary<4ul>
            ((((((pPVar1->super_OutputArchive<cereal::PortableBinaryOutputArchive,_1U>).self)->
               super_OutputArchive<cereal::PortableBinaryOutputArchive,_1U>).self)->
             super_OutputArchive<cereal::PortableBinaryOutputArchive,_1U>).self,args_2,4);
  pPVar1 = (pPVar1->super_OutputArchive<cereal::PortableBinaryOutputArchive,_1U>).self;
  cereal::PortableBinaryOutputArchive::saveBinary<4ul>
            ((((((pPVar1->super_OutputArchive<cereal::PortableBinaryOutputArchive,_1U>).self)->
               super_OutputArchive<cereal::PortableBinaryOutputArchive,_1U>).self)->
             super_OutputArchive<cereal::PortableBinaryOutputArchive,_1U>).self,args_3,4);
  cereal::PortableBinaryOutputArchive::saveBinary<4ul>
            ((((((pPVar1->super_OutputArchive<cereal::PortableBinaryOutputArchive,_1U>).self)->
               super_OutputArchive<cereal::PortableBinaryOutputArchive,_1U>).self)->
             super_OutputArchive<cereal::PortableBinaryOutputArchive,_1U>).self,args_4,4);
  std::__cxx11::stringbuf::str();
  binarydata::binarydata(__return_storage_ptr__,&local_2d8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2d8._M_dataplus._M_p != &local_2d8.field_2) {
    operator_delete(local_2d8._M_dataplus._M_p,local_2d8.field_2._M_allocated_capacity + 1);
  }
  local_2b8.super_OutputArchive<cereal::PortableBinaryOutputArchive,_1U>.super_OutputArchiveBase.
  _vptr_OutputArchiveBase = (_func_int **)&PTR__OutputArchive_003edee0;
  std::
  _Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable(&local_2b8.super_OutputArchive<cereal::PortableBinaryOutputArchive,_1U>.
                 itsVersionedTypes._M_h);
  std::
  _Hashtable<const_char_*,_std::pair<const_char_*const,_unsigned_int>,_std::allocator<std::pair<const_char_*const,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<const_char_*>,_std::hash<const_char_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable(&local_2b8.super_OutputArchive<cereal::PortableBinaryOutputArchive,_1U>.
                 itsPolymorphicTypeMap._M_h);
  std::
  _Hashtable<const_void_*,_std::pair<const_void_*const,_unsigned_int>,_std::allocator<std::pair<const_void_*const,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<const_void_*>,_std::hash<const_void_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable(&local_2b8.super_OutputArchive<cereal::PortableBinaryOutputArchive,_1U>.
                 itsSharedPointerMap._M_h);
  std::
  _Hashtable<cereal::traits::detail::base_class_id,_cereal::traits::detail::base_class_id,_std::allocator<cereal::traits::detail::base_class_id>,_std::__detail::_Identity,_std::equal_to<cereal::traits::detail::base_class_id>,_cereal::traits::detail::base_class_id_hash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  ::~_Hashtable(&local_2b8.super_OutputArchive<cereal::PortableBinaryOutputArchive,_1U>.
                 itsBaseClassSet._M_h);
  std::__cxx11::ostringstream::~ostringstream(local_1a8);
  std::ios_base::~ios_base(local_138);
  return __return_storage_ptr__;
}

Assistant:

static binarydata serializedata(T & ... args){
        std::ostringstream stream;
        cereal::PortableBinaryOutputArchive archive(stream);
        archive(args...);
        return binarydata(stream.str());
    }